

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_concurrent.hpp
# Opt level: O3

void boost::unordered::detail::foa::
     concurrent_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
     ::set_group_access(new_allocator<boost::unordered::detail::foa::group_access> *param_1,
                       long param_2)

{
  group_access *pgVar1;
  ulong uVar2;
  
  pgVar1 = __gnu_cxx::new_allocator<boost::unordered::detail::foa::group_access>::allocate
                     (param_1,*(long *)(param_2 + 8) + 1,(void *)0x0);
  *(group_access **)(param_2 + 0x20) = pgVar1;
  if (*(long *)(param_2 + 8) != -1) {
    uVar2 = 0;
    do {
      *(undefined8 *)(*(long *)(param_2 + 0x20) + uVar2 * 8) = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(long *)(param_2 + 8) + 1U);
  }
  return;
}

Assistant:

static void set_group_access(group_access_allocator_type al, concurrent_table_arrays& arrays,
                                 std::false_type /* fancy pointers */) {
        arrays.group_accesses_ = std::allocator_traits<std::remove_cvref_t<decltype(al)>>::allocate(
            al, arrays.groups_size_mask + 1);

        for (std::size_t i = 0; i < arrays.groups_size_mask + 1; ++i) {
            ::new (arrays.group_accesses() + i) group_access();
        }
    }